

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr __thiscall c4::yml::from_next_line(yml *this,csubstr rem)

{
  yml *pyVar1;
  yml *pyVar2;
  code *pcVar3;
  bool bVar4;
  char *pcVar5;
  yml *pyVar6;
  size_t sVar7;
  csubstr cVar8;
  ro_substr chars;
  basic_substring<const_char> local_38;
  basic_substring<const_char> local_28;
  
  local_38.len = (size_t)rem.str;
  chars.len = 2;
  chars.str = "\r\n";
  local_38.str = (char *)this;
  pcVar5 = (char *)basic_substring<const_char>::first_of(&local_38,chars,0);
  if (pcVar5 == (char *)0xffffffffffffffff) {
    pyVar6 = (yml *)0x0;
    sVar7 = 0;
  }
  else {
    if (local_38.len <= pcVar5) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        cVar8 = (csubstr)(*pcVar3)();
        return cVar8;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    pyVar1 = (yml *)(local_38.str + (long)pcVar5);
    if (local_38.len < pcVar5) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        cVar8 = (csubstr)(*pcVar3)();
        return cVar8;
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x157b,"pos <= len || pos == npos");
    }
    pyVar2 = (yml *)(local_38.str + (long)pcVar5);
    local_38.str = (char *)(pyVar2 + 1);
    local_38.len = local_38.len - (long)(pcVar5 + 1);
    pyVar6 = (yml *)0x0;
    sVar7 = 0;
    if (local_38.len != 0) {
      if (((yml)*local_38.str == (yml)0xd && *pyVar1 == (yml)0xa) ||
         (pyVar6 = (yml *)local_38.str, sVar7 = local_38.len,
         (yml)*local_38.str == (yml)0xa && *pyVar1 == (yml)0xd)) {
        if (local_38.len == 0) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar3 = (code *)swi(3);
            cVar8 = (csubstr)(*pcVar3)();
            return cVar8;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_28,(char *)(pyVar2 + 2),local_38.len - 1);
        pyVar6 = (yml *)local_28.str;
        sVar7 = local_28.len;
      }
    }
  }
  cVar8.len = sVar7;
  cVar8.str = (char *)pyVar6;
  return cVar8;
}

Assistant:

csubstr from_next_line(csubstr rem)
{
    size_t nlpos = rem.first_of("\r\n");
    if(nlpos == csubstr::npos)
        return {};
    const char nl = rem[nlpos];
    rem = rem.right_of(nlpos);
    if(rem.empty())
        return {};
    if(_extend_from_combined_newline(nl, rem.front()))
        rem = rem.sub(1);
    return rem;
}